

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O0

void Bal_ManFree(Bal_Man_t *p)

{
  Bal_Man_t *p_local;
  
  Vec_PtrFreeFree(p->vCutSets);
  Vec_IntFree(p->vCosts);
  if (p != (Bal_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Bal_ManFree( Bal_Man_t * p )
{
    Vec_PtrFreeFree( p->vCutSets );
    Vec_IntFree( p->vCosts );
    ABC_FREE( p );
}